

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O1

SizeRange * __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::mutable_widthrange
          (ImageFeatureType_ImageSizeRange *this)

{
  ulong uVar1;
  SizeRange *pSVar2;
  Arena *arena;
  
  if (this->widthrange_ == (SizeRange *)0x0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pSVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SizeRange>(arena);
    this->widthrange_ = pSVar2;
  }
  return this->widthrange_;
}

Assistant:

inline ::CoreML::Specification::SizeRange* ImageFeatureType_ImageSizeRange::mutable_widthrange() {
  ::CoreML::Specification::SizeRange* _msg = _internal_mutable_widthrange();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.ImageSizeRange.widthRange)
  return _msg;
}